

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

IndexVector * __thiscall
Centaurus::CharClass<wchar_t>::collect_borders
          (IndexVector *__return_storage_ptr__,CharClass<wchar_t> *this)

{
  wchar_t wVar1;
  pointer pRVar2;
  undefined8 in_RAX;
  int *piVar3;
  iterator iVar4;
  Range<wchar_t> *r;
  pointer pRVar5;
  undefined8 local_38;
  
  local_38 = in_RAX;
  IndexVector::IndexVector
            (__return_storage_ptr__,
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,true);
  pRVar5 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar5 != pRVar2) {
    do {
      wVar1 = pRVar5->m_start;
      iVar4._M_current =
           (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      piVar3 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      local_38._4_4_ = wVar1;
      if (iVar4._M_current == piVar3) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,iVar4,
                   (int *)((long)&local_38 + 4));
        iVar4._M_current =
             (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        piVar3 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
      }
      else {
        *iVar4._M_current = wVar1;
        iVar4._M_current = iVar4._M_current + 1;
        (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar4._M_current;
      }
      local_38 = CONCAT44(local_38._4_4_,pRVar5->m_end);
      if (iVar4._M_current == piVar3) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,iVar4,
                   (int *)&local_38);
      }
      else {
        *iVar4._M_current = pRVar5->m_end;
        (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar4._M_current + 1;
      }
      pRVar5 = pRVar5 + 1;
    } while (pRVar5 != pRVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector collect_borders() const
    {
        IndexVector ret(2 * m_ranges.size(), true);

        for (const auto& r : m_ranges)
        {
            ret.push_back(r.start());
            ret.push_back(r.end());
        }

        return ret;
    }